

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

int binstrr(bstring b1,int pos,bstring b2)

{
  int iVar1;
  uchar *d1;
  uchar *d0;
  int local_30;
  int l;
  int i;
  int j;
  bstring b2_local;
  int pos_local;
  bstring b1_local;
  
  if ((((b1 == (bstring)0x0) || (b1->data == (uchar *)0x0)) || (b1->slen < 0)) ||
     (((b2 == (bstring)0x0 || (b2->data == (uchar *)0x0)) || (b2->slen < 0)))) {
    b1_local._4_4_ = -1;
  }
  else {
    b1_local._4_4_ = pos;
    if ((b1->slen != pos) || (b2->slen != 0)) {
      if ((b1->slen < pos) || (pos < 0)) {
        b1_local._4_4_ = -1;
      }
      else if (b2->slen != 0) {
        if (((b1->data == b2->data) && (pos == 0)) && (b2->slen <= b1->slen)) {
          b1_local._4_4_ = 0;
        }
        else {
          iVar1 = b1->slen - b2->slen;
          if (iVar1 < 0) {
            b1_local._4_4_ = -1;
          }
          else {
            local_30 = pos;
            if (iVar1 + 1 <= pos) {
              local_30 = iVar1;
            }
            l = 0;
            do {
              while (b2->data[l] != b1->data[local_30 + l]) {
                local_30 = local_30 + -1;
                if (local_30 < 0) {
                  return -1;
                }
                l = 0;
              }
              l = l + 1;
            } while (l < b2->slen);
            b1_local._4_4_ = local_30;
          }
        }
      }
    }
  }
  return b1_local._4_4_;
}

Assistant:

int binstrr (const bstring b1, int pos, const bstring b2) {
int j, i, l;
unsigned char * d0, * d1;

	if (b1 == NULL || b1->data == NULL || b1->slen < 0 ||
	    b2 == NULL || b2->data == NULL || b2->slen < 0) return BSTR_ERR;
	if (b1->slen == pos && b2->slen == 0) return pos;
	if (b1->slen < pos || pos < 0) return BSTR_ERR;
	if (b2->slen == 0) return pos;

	/* Obvious alias case */
	if (b1->data == b2->data && pos == 0 && b2->slen <= b1->slen) return 0;

	i = pos;
	if ((l = b1->slen - b2->slen) < 0) return BSTR_ERR;

	/* If no space to find such a string then snap back */
	if (l + 1 <= i) i = l;
	j = 0;

	d0 = b2->data;
	d1 = b1->data;
	l  = b2->slen;

	for (;;) {
		if (d0[j] == d1[i + j]) {
			j ++;
			if (j >= l) return i;
		} else {
			i --;
			if (i < 0) break;
			j=0;
		}
	}

	return BSTR_ERR;
}